

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O3

int lj_cf_debug_sethook(lua_State *L)

{
  TValue *pTVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  lua_Integer lVar5;
  char *pcVar6;
  char *pcVar7;
  int idx;
  code *func;
  uint uVar8;
  
  uVar8 = 0;
  if (L->base < L->top) {
    uVar8 = (uint)((L->base->field_4).it >> 0xf == 0x1fff9);
  }
  idx = uVar8 + 1;
  iVar3 = lua_type(L,idx);
  if (iVar3 < 1) {
    lua_settop(L,idx);
    iVar3 = 0;
    func = (lua_Hook)0x0;
    uVar8 = 0;
  }
  else {
    pcVar4 = luaL_checklstring(L,uVar8 + 2,(size_t *)0x0);
    luaL_checktype(L,idx,6);
    lVar5 = luaL_optinteger(L,uVar8 + 3,0);
    iVar3 = (int)lVar5;
    pcVar6 = strchr(pcVar4,99);
    pcVar7 = strchr(pcVar4,0x72);
    uVar8 = (pcVar6 != (char *)0x0) + 2;
    if (pcVar7 == (char *)0x0) {
      uVar8 = (uint)(pcVar6 != (char *)0x0);
    }
    pcVar4 = strchr(pcVar4,0x6c);
    uVar2 = uVar8 + 4;
    if (pcVar4 == (char *)0x0) {
      uVar2 = uVar8;
    }
    uVar8 = uVar2 + 8;
    if (iVar3 < 1) {
      uVar8 = uVar2;
    }
    func = hookf;
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->n = -5.13828271674896e-322;
  lua_pushvalue(L,idx);
  lua_rawset(L,-10000);
  lua_sethook(L,func,uVar8,iVar3);
  return 0;
}

Assistant:

LJLIB_CF(debug_sethook)
{
  int arg, mask, count;
  lua_Hook func;
  (void)getthread(L, &arg);
  if (lua_isnoneornil(L, arg+1)) {
    lua_settop(L, arg+1);
    func = NULL; mask = 0; count = 0;  /* turn off hooks */
  } else {
    const char *smask = luaL_checkstring(L, arg+2);
    luaL_checktype(L, arg+1, LUA_TFUNCTION);
    count = luaL_optint(L, arg+3, 0);
    func = hookf; mask = makemask(smask, count);
  }
  (L->top++)->u64 = KEY_HOOK;
  lua_pushvalue(L, arg+1);
  lua_rawset(L, LUA_REGISTRYINDEX);
  lua_sethook(L, func, mask, count);
  return 0;
}